

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O2

void __thiscall
GraphMaker::new_graph_from_long_datastore
          (GraphMaker *this,LongReadsDatastore *ds,int k,int min_coverage,int num_batches)

{
  _Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_> local_30;
  
  BatchKmersCounter::countKmersToList
            ((vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)&local_30,ds,k,
             min_coverage,num_batches);
  new_graph_from_kmerlist_128
            (this,(vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)&local_30,
             (uint8_t)k);
  std::_Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>::~_Vector_base(&local_30)
  ;
  return;
}

Assistant:

void GraphMaker::new_graph_from_long_datastore(const LongReadsDatastore& ds,  int k, int min_coverage, int num_batches) {
    new_graph_from_kmerlist_128(BatchKmersCounter::countKmersToList(ds, k, min_coverage, num_batches),k);
}